

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

invalid_cla_id * __thiscall
boost::runtime::specific_param_error<boost::runtime::invalid_cla_id,boost::runtime::init_error>::
operator<<(specific_param_error<boost::runtime::invalid_cla_id,_boost::runtime::init_error> *this,
          basic_cstring<const_char> *val)

{
  long in_RSI;
  invalid_cla_id *in_RDI;
  basic_cstring<const_char> *in_stack_00000128;
  invalid_cla_id *in_stack_ffffffffffffff88;
  invalid_cla_id *this_00;
  string local_38 [56];
  
  this_00 = in_RDI;
  unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>(in_stack_00000128);
  std::__cxx11::string::append((string *)(in_RSI + 0x18));
  std::__cxx11::string::~string(local_38);
  invalid_cla_id::invalid_cla_id(this_00,in_stack_ffffffffffffff88);
  return in_RDI;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }